

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
cfd::core::Deserializer::ReadVariableBuffer
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Deserializer *this)

{
  uint uVar1;
  pointer puVar2;
  uint64_t size;
  allocator_type local_21;
  
  size = ReadVariableInt(this);
  if (size == 0) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    CheckReadSize(this,size);
    uVar1 = this->offset_;
    puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,size,
               &local_21);
    memcpy((__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start,puVar2 + uVar1,size);
    this->offset_ = this->offset_ + (int)size;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Deserializer::ReadVariableBuffer() {
  // TODO(k-matsuzawa) need endian support.
  uint64_t data_size = ReadVariableInt();
  if (data_size == 0) {
    return std::vector<uint8_t>();
  }
  CheckReadSize(data_size);

  uint8_t* buf = buffer_.data() + offset_;
  std::vector<uint8_t> result(data_size);
  memcpy(result.data(), buf, data_size);
  offset_ += static_cast<uint32_t>(data_size);
  return result;
}